

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subcircuit.cpp
# Opt level: O0

bool __thiscall SubCircuit<4>::propagateSCC(SubCircuit<4> *this,int root)

{
  bool bVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  int *piVar5;
  SubCircuit<4> *this_00;
  Lit *pLVar6;
  PROP *pPVar7;
  int in_ESI;
  long in_RDI;
  PROP p;
  uint i_21;
  int i_20;
  Clause *r_4;
  Lit evidenceLast;
  int i_19;
  vec<int> earlierSubtree;
  vec<int> lastSubtreeAndOutside;
  int outsideVar;
  uint i_18;
  Clause *r_3;
  Lit evidenceSeen;
  int numNotSeen;
  int var;
  vec<int> notseen;
  vec<int> seen;
  uint i_17;
  uint i_16;
  int size3_1;
  int size2_1;
  int size1_1;
  uint i_15;
  uint i_14;
  vec<int> this_later_1;
  uint i_13;
  uint i_12;
  vec<int> prev_this_later_1;
  uint i_11;
  uint i_10;
  vec<int> prev_later_1;
  Clause *r_2;
  Clause *r;
  int size3;
  int size2;
  int size1;
  uint i_9;
  uint i_8;
  vec<int> this_later;
  uint i_7;
  uint i_6;
  vec<int> prev_this_later;
  uint i_5;
  uint i_4;
  vec<int> prev_later;
  Clause *r_1;
  uint i_3;
  vec<int> alloutside;
  Lit evidenceOther;
  Lit evidenceThis;
  int i_2;
  int child;
  iterator i_1;
  int endSubtree;
  int startSubtree;
  int i;
  vec<int> thisSubtree;
  int numback;
  int backto;
  int backfrom;
  iterator *in_stack_fffffffffffff9f8;
  int iVar8;
  undefined4 in_stack_fffffffffffffa00;
  int in_stack_fffffffffffffa04;
  undefined4 in_stack_fffffffffffffa08;
  uint in_stack_fffffffffffffa0c;
  anon_union_8_2_743a5d44_for_Reason_0 in_stack_fffffffffffffa10;
  vec<int> *in_stack_fffffffffffffa18;
  undefined6 in_stack_fffffffffffffa20;
  undefined1 in_stack_fffffffffffffa26;
  undefined1 in_stack_fffffffffffffa27;
  int in_stack_fffffffffffffa3c;
  vec<int> *in_stack_fffffffffffffa40;
  undefined4 in_stack_fffffffffffffa48;
  undefined4 in_stack_fffffffffffffa4c;
  undefined8 in_stack_fffffffffffffa50;
  SubCircuit<4> *pSVar9;
  undefined4 in_stack_fffffffffffffa58;
  undefined4 in_stack_fffffffffffffa5c;
  SubCircuit<4> *in_stack_fffffffffffffa60;
  undefined4 in_stack_fffffffffffffa68;
  undefined4 in_stack_fffffffffffffa6c;
  long in_stack_fffffffffffffa70;
  Reason local_3e0;
  Reason local_3d8;
  Clause *local_3d0;
  undefined8 local_3c8;
  ulong local_3c0;
  uint local_3b8;
  int local_3b4;
  SubCircuit<4> *local_390;
  int local_384;
  Lit local_370;
  int local_36c;
  vec<int> local_368;
  int *in_stack_fffffffffffffca8;
  int *in_stack_fffffffffffffcb0;
  undefined4 in_stack_fffffffffffffcbc;
  int in_stack_fffffffffffffcc0;
  int iVar10;
  int in_stack_fffffffffffffcc4;
  SubCircuit<4> *in_stack_fffffffffffffcc8;
  int *in_stack_fffffffffffffce0;
  Clause *local_318;
  Lit local_2f4;
  int local_2f0;
  int local_2ec;
  vec<int> local_2e8;
  vec<int> local_2d8;
  uint local_2c8;
  uint local_2c4;
  int local_25c;
  int local_258;
  int local_254;
  uint local_250;
  uint local_24c;
  vec<int> local_248;
  uint local_238;
  uint local_234;
  vec<int> local_230;
  uint local_220;
  uint local_21c;
  vec<int> local_218 [3];
  Clause *local_1e8;
  Reason local_1e0 [13];
  Clause *local_178;
  int local_16c;
  int local_168;
  int local_164;
  uint local_160;
  uint local_15c;
  vec<int> local_158;
  uint local_148;
  uint local_144;
  vec<int> local_140;
  uint local_130;
  uint local_12c;
  vec<int> local_128;
  Reason local_118 [5];
  Clause *local_f0;
  int local_e8;
  int local_e4;
  int local_d0;
  uint local_cc;
  vec<int> local_c8 [2];
  Lit local_a4 [5];
  Lit local_90;
  int local_8c;
  int local_88;
  int local_84;
  int local_4c;
  int local_48;
  int local_34;
  vec<int> local_30;
  iterator local_20;
  byte local_1;
  int reasonIndex;
  
  local_20.forward.var._0_4_ = 0;
  local_20.view._4_4_ = 0;
  local_20.view._0_4_ = 0;
  local_20.forward.var._4_4_ = in_ESI;
  vec<int>::vec(&local_30);
  vec<int>::reserve((vec<int> *)in_stack_fffffffffffffa10._pt,in_stack_fffffffffffffa0c);
  vec<int>::clear((vec<int> *)CONCAT44(in_stack_fffffffffffffa04,in_stack_fffffffffffffa00),
                  SUB81((ulong)in_stack_fffffffffffff9f8 >> 0x38,0));
  vec<int>::clear((vec<int> *)CONCAT44(in_stack_fffffffffffffa04,in_stack_fffffffffffffa00),
                  SUB81((ulong)in_stack_fffffffffffff9f8 >> 0x38,0));
  vec<int>::clear((vec<int> *)CONCAT44(in_stack_fffffffffffffa04,in_stack_fffffffffffffa00),
                  SUB81((ulong)in_stack_fffffffffffff9f8 >> 0x38,0));
  for (local_34 = 0; local_34 < *(int *)(in_RDI + 0x14); local_34 = local_34 + 1) {
    *(undefined4 *)(*(long *)(in_RDI + 0xa0) + (long)local_34 * 4) = 0xffffffff;
  }
  *(undefined4 *)(*(long *)(in_RDI + 0xa0) + (long)local_20.forward.var._4_4_ * 4) = 0;
  *(undefined4 *)(*(long *)(in_RDI + 0xa8) + (long)local_20.forward.var._4_4_ * 4) = 0;
  *(undefined4 *)(in_RDI + 0xb0) = 1;
  vec<SubCircuit<4>::PROP>::clear
            ((vec<SubCircuit<4>::PROP> *)
             CONCAT44(in_stack_fffffffffffffa04,in_stack_fffffffffffffa00),
             SUB81((ulong)in_stack_fffffffffffff9f8 >> 0x38,0));
  local_48 = 0;
  local_4c = 0;
  IntView<4>::begin((IntView<4> *)in_stack_fffffffffffffa40);
  while( true ) {
    IntView<4>::end((IntView<4> *)in_stack_fffffffffffffa40);
    bVar1 = IntView<4>::iterator::operator!=
                      ((iterator *)CONCAT44(in_stack_fffffffffffffa04,in_stack_fffffffffffffa00),
                       in_stack_fffffffffffff9f8);
    if (!bVar1) break;
    local_84 = IntView<4>::iterator::operator*
                         ((iterator *)CONCAT44(in_stack_fffffffffffffa04,in_stack_fffffffffffffa00))
    ;
    if (*(int *)(*(long *)(in_RDI + 0xa0) + (long)local_84 * 4) == -1) {
      local_20.view._0_4_ = 0;
      in_stack_fffffffffffff9f8 = &local_20;
      bVar1 = exploreSubtree(in_stack_fffffffffffffcc8,in_stack_fffffffffffffcc4,
                             in_stack_fffffffffffffcc0,in_stack_fffffffffffffcbc,
                             in_stack_fffffffffffffcb0,in_stack_fffffffffffffca8,
                             in_stack_fffffffffffffce0);
      if (!bVar1) {
        local_1 = 0;
        local_88 = 1;
        goto LAB_0018a6cc;
      }
      vec<int>::clear((vec<int> *)CONCAT44(in_stack_fffffffffffffa04,in_stack_fffffffffffffa00),
                      SUB81((ulong)in_stack_fffffffffffff9f8 >> 0x38,0));
      vec<int>::clear((vec<int> *)CONCAT44(in_stack_fffffffffffffa04,in_stack_fffffffffffffa00),
                      SUB81((ulong)in_stack_fffffffffffff9f8 >> 0x38,0));
      for (local_8c = 0; local_8c < *(int *)(in_RDI + 0x14); local_8c = local_8c + 1) {
        if (*(int *)(*(long *)(in_RDI + 0xa0) + (long)local_8c * 4) < 0) {
          vec<int>::push((vec<int> *)in_stack_fffffffffffffa10._pt,
                         (int *)CONCAT44(in_stack_fffffffffffffa0c,in_stack_fffffffffffffa08));
        }
        else if (local_4c < *(int *)(*(long *)(in_RDI + 0xa0) + (long)local_8c * 4)) {
          vec<int>::push((vec<int> *)in_stack_fffffffffffffa10._pt,
                         (int *)CONCAT44(in_stack_fffffffffffffa0c,in_stack_fffffffffffffa08));
        }
      }
      vec<int>::vec<int>((vec<int> *)
                         CONCAT17(in_stack_fffffffffffffa27,
                                  CONCAT16(in_stack_fffffffffffffa26,in_stack_fffffffffffffa20)),
                         in_stack_fffffffffffffa18);
      local_90 = getEvidenceLit((SubCircuit<4> *)
                                CONCAT44(in_stack_fffffffffffffa6c,in_stack_fffffffffffffa68),
                                (vec<int> *)in_stack_fffffffffffffa60);
      vec<int>::~vec((vec<int> *)CONCAT44(in_stack_fffffffffffffa04,in_stack_fffffffffffffa00));
      vec<int>::vec<int>((vec<int> *)
                         CONCAT17(in_stack_fffffffffffffa27,
                                  CONCAT16(in_stack_fffffffffffffa26,in_stack_fffffffffffffa20)),
                         in_stack_fffffffffffffa18);
      local_a4[0] = getEvidenceLit((SubCircuit<4> *)
                                   CONCAT44(in_stack_fffffffffffffa6c,in_stack_fffffffffffffa68),
                                   (vec<int> *)in_stack_fffffffffffffa60);
      vec<int>::~vec((vec<int> *)CONCAT44(in_stack_fffffffffffffa04,in_stack_fffffffffffffa00));
      vec<int>::vec(local_c8);
      uVar3 = vec<int>::size((vec<int> *)(in_RDI + 0x60));
      if (uVar3 == 0) {
        for (local_cc = 0; uVar3 = local_cc, uVar4 = vec<int>::size((vec<int> *)(in_RDI + 0x80)),
            uVar3 < uVar4; local_cc = local_cc + 1) {
          vec<int>::operator[]((vec<int> *)(in_RDI + 0x80),local_cc);
          vec<int>::push((vec<int> *)in_stack_fffffffffffffa10._pt,
                         (int *)CONCAT44(in_stack_fffffffffffffa0c,in_stack_fffffffffffffa08));
        }
        vec<int>::push((vec<int> *)in_stack_fffffffffffffa10._pt,
                       (int *)CONCAT44(in_stack_fffffffffffffa0c,in_stack_fffffffffffffa08));
        vec<int>::vec<int>((vec<int> *)
                           CONCAT17(in_stack_fffffffffffffa27,
                                    CONCAT16(in_stack_fffffffffffffa26,in_stack_fffffffffffffa20)),
                           in_stack_fffffffffffffa18);
        local_d0 = (int)getEvidenceLit((SubCircuit<4> *)
                                       CONCAT44(in_stack_fffffffffffffa6c,in_stack_fffffffffffffa68)
                                       ,(vec<int> *)in_stack_fffffffffffffa60);
        local_a4[0] = (Lit)local_d0;
        vec<int>::~vec((vec<int> *)CONCAT44(in_stack_fffffffffffffa04,in_stack_fffffffffffffa00));
      }
      local_e4 = ::lit_True.x;
      bVar1 = Lit::operator!=(&local_90,::lit_True);
      if (bVar1) {
        local_e8 = ::lit_True.x;
        bVar1 = Lit::operator!=(local_a4,::lit_True);
        if (!bVar1) goto LAB_00189a72;
        if ((int)local_20.view != 0) {
          if (((*(byte *)(in_RDI + 0x25) & 1) != 0) && ((int)local_20.view == 1)) {
            local_1e8 = (Clause *)0x0;
            if ((so.lazy & 1U) != 0) {
              uVar3 = vec<int>::size((vec<int> *)(in_RDI + 0x60));
              iVar10 = (int)((ulong)in_stack_fffffffffffff9f8 >> 0x20);
              if (uVar3 == 0) {
                vec<int>::size(&local_30);
                vec<int>::size(local_c8);
                local_1e8 = ::Reason_new(in_stack_fffffffffffffa04);
                pLVar6 = Clause::operator[]((Clause *)
                                            CONCAT44(in_stack_fffffffffffffa04,
                                                     in_stack_fffffffffffffa00),iVar10);
                pLVar6->x = local_90.x;
                pLVar6 = Clause::operator[]((Clause *)
                                            CONCAT44(in_stack_fffffffffffffa04,
                                                     in_stack_fffffffffffffa00),iVar10);
                pLVar6->x = local_a4[0].x;
                vec<int>::vec<int>((vec<int> *)
                                   CONCAT17(in_stack_fffffffffffffa27,
                                            CONCAT16(in_stack_fffffffffffffa26,
                                                     in_stack_fffffffffffffa20)),
                                   in_stack_fffffffffffffa18);
                vec<int>::vec<int>((vec<int> *)
                                   CONCAT17(in_stack_fffffffffffffa27,
                                            CONCAT16(in_stack_fffffffffffffa26,
                                                     in_stack_fffffffffffffa20)),
                                   in_stack_fffffffffffffa18);
                in_stack_fffffffffffff9f8 = (iterator *)CONCAT44(iVar10,local_20.view._4_4_);
                explainAcantreachB(in_stack_fffffffffffffa60,
                                   (Clause *)
                                   CONCAT44(in_stack_fffffffffffffa5c,in_stack_fffffffffffffa58),
                                   (int)((ulong)in_stack_fffffffffffffa50 >> 0x20),
                                   (vec<int> *)
                                   CONCAT44(in_stack_fffffffffffffa4c,in_stack_fffffffffffffa48),
                                   in_stack_fffffffffffffa40,in_stack_fffffffffffffa3c,
                                   (int)in_stack_fffffffffffffa70);
                vec<int>::~vec((vec<int> *)
                               CONCAT44(in_stack_fffffffffffffa04,in_stack_fffffffffffffa00));
                vec<int>::~vec((vec<int> *)
                               CONCAT44(in_stack_fffffffffffffa04,in_stack_fffffffffffffa00));
              }
              else {
                vec<int>::vec(local_218);
                for (local_21c = 0; uVar3 = local_21c,
                    uVar4 = vec<int>::size((vec<int> *)(in_RDI + 0x60)), uVar3 < uVar4;
                    local_21c = local_21c + 1) {
                  vec<int>::operator[]((vec<int> *)(in_RDI + 0x60),local_21c);
                  vec<int>::push((vec<int> *)in_stack_fffffffffffffa10._pt,
                                 (int *)CONCAT44(in_stack_fffffffffffffa0c,in_stack_fffffffffffffa08
                                                ));
                }
                for (local_220 = 0; uVar3 = local_220,
                    uVar4 = vec<int>::size((vec<int> *)(in_RDI + 0x80)), uVar3 < uVar4;
                    local_220 = local_220 + 1) {
                  vec<int>::operator[]((vec<int> *)(in_RDI + 0x80),local_220);
                  vec<int>::push((vec<int> *)in_stack_fffffffffffffa10._pt,
                                 (int *)CONCAT44(in_stack_fffffffffffffa0c,in_stack_fffffffffffffa08
                                                ));
                }
                vec<int>::vec(&local_230);
                for (local_234 = 0; uVar3 = local_234, uVar4 = vec<int>::size(local_218),
                    uVar3 < uVar4; local_234 = local_234 + 1) {
                  vec<int>::operator[](local_218,local_234);
                  vec<int>::push((vec<int> *)in_stack_fffffffffffffa10._pt,
                                 (int *)CONCAT44(in_stack_fffffffffffffa0c,in_stack_fffffffffffffa08
                                                ));
                }
                for (local_238 = 0; uVar3 = local_238, uVar4 = vec<int>::size(&local_30),
                    uVar3 < uVar4; local_238 = local_238 + 1) {
                  vec<int>::operator[](&local_30,local_238);
                  vec<int>::push((vec<int> *)in_stack_fffffffffffffa10._pt,
                                 (int *)CONCAT44(in_stack_fffffffffffffa0c,in_stack_fffffffffffffa08
                                                ));
                }
                vec<int>::vec(&local_248);
                for (local_24c = 0; uVar3 = local_24c, uVar4 = vec<int>::size(&local_30),
                    uVar3 < uVar4; local_24c = local_24c + 1) {
                  vec<int>::operator[](&local_30,local_24c);
                  vec<int>::push((vec<int> *)in_stack_fffffffffffffa10._pt,
                                 (int *)CONCAT44(in_stack_fffffffffffffa0c,in_stack_fffffffffffffa08
                                                ));
                }
                local_250 = 0;
                while( true ) {
                  uVar3 = local_250;
                  uVar4 = vec<int>::size((vec<int> *)(in_RDI + 0x80));
                  iVar10 = (int)((ulong)in_stack_fffffffffffff9f8 >> 0x20);
                  if (uVar4 <= uVar3) break;
                  vec<int>::operator[]((vec<int> *)(in_RDI + 0x80),local_250);
                  vec<int>::push((vec<int> *)in_stack_fffffffffffffa10._pt,
                                 (int *)CONCAT44(in_stack_fffffffffffffa0c,in_stack_fffffffffffffa08
                                                ));
                  local_250 = local_250 + 1;
                }
                uVar3 = vec<int>::size((vec<int> *)(in_RDI + 0x70));
                uVar4 = vec<int>::size(&local_230);
                local_254 = uVar3 * uVar4;
                uVar3 = vec<int>::size((vec<int> *)(in_RDI + 0x60));
                uVar4 = vec<int>::size(&local_248);
                local_258 = uVar3 * uVar4;
                uVar3 = vec<int>::size(&local_30);
                uVar4 = vec<int>::size(local_218);
                local_25c = uVar3 * uVar4;
                local_1e8 = ::Reason_new(in_stack_fffffffffffffa04);
                pLVar6 = Clause::operator[]((Clause *)
                                            CONCAT44(in_stack_fffffffffffffa04,
                                                     in_stack_fffffffffffffa00),iVar10);
                pLVar6->x = local_90.x;
                pLVar6 = Clause::operator[]((Clause *)
                                            CONCAT44(in_stack_fffffffffffffa04,
                                                     in_stack_fffffffffffffa00),iVar10);
                pLVar6->x = local_a4[0].x;
                vec<int>::vec<int>((vec<int> *)
                                   CONCAT17(in_stack_fffffffffffffa27,
                                            CONCAT16(in_stack_fffffffffffffa26,
                                                     in_stack_fffffffffffffa20)),
                                   in_stack_fffffffffffffa18);
                vec<int>::vec<int>((vec<int> *)
                                   CONCAT17(in_stack_fffffffffffffa27,
                                            CONCAT16(in_stack_fffffffffffffa26,
                                                     in_stack_fffffffffffffa20)),
                                   in_stack_fffffffffffffa18);
                explainAcantreachB(in_stack_fffffffffffffa60,
                                   (Clause *)
                                   CONCAT44(in_stack_fffffffffffffa5c,in_stack_fffffffffffffa58),
                                   (int)((ulong)in_stack_fffffffffffffa50 >> 0x20),
                                   (vec<int> *)
                                   CONCAT44(in_stack_fffffffffffffa4c,in_stack_fffffffffffffa48),
                                   in_stack_fffffffffffffa40,in_stack_fffffffffffffa3c,
                                   (int)in_stack_fffffffffffffa70);
                vec<int>::~vec((vec<int> *)
                               CONCAT44(in_stack_fffffffffffffa04,in_stack_fffffffffffffa00));
                vec<int>::~vec((vec<int> *)
                               CONCAT44(in_stack_fffffffffffffa04,in_stack_fffffffffffffa00));
                vec<int>::vec<int>((vec<int> *)
                                   CONCAT17(in_stack_fffffffffffffa27,
                                            CONCAT16(in_stack_fffffffffffffa26,
                                                     in_stack_fffffffffffffa20)),
                                   in_stack_fffffffffffffa18);
                vec<int>::vec<int>((vec<int> *)
                                   CONCAT17(in_stack_fffffffffffffa27,
                                            CONCAT16(in_stack_fffffffffffffa26,
                                                     in_stack_fffffffffffffa20)),
                                   in_stack_fffffffffffffa18);
                explainAcantreachB(in_stack_fffffffffffffa60,
                                   (Clause *)
                                   CONCAT44(in_stack_fffffffffffffa5c,in_stack_fffffffffffffa58),
                                   (int)((ulong)in_stack_fffffffffffffa50 >> 0x20),
                                   (vec<int> *)
                                   CONCAT44(in_stack_fffffffffffffa4c,in_stack_fffffffffffffa48),
                                   in_stack_fffffffffffffa40,in_stack_fffffffffffffa3c,
                                   (int)in_stack_fffffffffffffa70);
                vec<int>::~vec((vec<int> *)
                               CONCAT44(in_stack_fffffffffffffa04,in_stack_fffffffffffffa00));
                vec<int>::~vec((vec<int> *)
                               CONCAT44(in_stack_fffffffffffffa04,in_stack_fffffffffffffa00));
                vec<int>::vec<int>((vec<int> *)
                                   CONCAT17(in_stack_fffffffffffffa27,
                                            CONCAT16(in_stack_fffffffffffffa26,
                                                     in_stack_fffffffffffffa20)),
                                   in_stack_fffffffffffffa18);
                vec<int>::vec<int>((vec<int> *)
                                   CONCAT17(in_stack_fffffffffffffa27,
                                            CONCAT16(in_stack_fffffffffffffa26,
                                                     in_stack_fffffffffffffa20)),
                                   in_stack_fffffffffffffa18);
                in_stack_fffffffffffff9f8 = (iterator *)CONCAT44(iVar10,local_20.view._4_4_);
                explainAcantreachB(in_stack_fffffffffffffa60,
                                   (Clause *)
                                   CONCAT44(in_stack_fffffffffffffa5c,in_stack_fffffffffffffa58),
                                   (int)((ulong)in_stack_fffffffffffffa50 >> 0x20),
                                   (vec<int> *)
                                   CONCAT44(in_stack_fffffffffffffa4c,in_stack_fffffffffffffa48),
                                   in_stack_fffffffffffffa40,in_stack_fffffffffffffa3c,
                                   (int)in_stack_fffffffffffffa70);
                vec<int>::~vec((vec<int> *)
                               CONCAT44(in_stack_fffffffffffffa04,in_stack_fffffffffffffa00));
                vec<int>::~vec((vec<int> *)
                               CONCAT44(in_stack_fffffffffffffa04,in_stack_fffffffffffffa00));
                vec<int>::~vec((vec<int> *)
                               CONCAT44(in_stack_fffffffffffffa04,in_stack_fffffffffffffa00));
                vec<int>::~vec((vec<int> *)
                               CONCAT44(in_stack_fffffffffffffa04,in_stack_fffffffffffffa00));
                vec<int>::~vec((vec<int> *)
                               CONCAT44(in_stack_fffffffffffffa04,in_stack_fffffffffffffa00));
              }
            }
            addPropagation((SubCircuit<4> *)
                           CONCAT17(in_stack_fffffffffffffa27,
                                    CONCAT16(in_stack_fffffffffffffa26,in_stack_fffffffffffffa20)),
                           SUB81((ulong)in_stack_fffffffffffffa18 >> 0x38,0),
                           (int)in_stack_fffffffffffffa18,
                           (int)((ulong)in_stack_fffffffffffffa10 >> 0x20),
                           (Clause *)CONCAT44(in_stack_fffffffffffffa0c,in_stack_fffffffffffffa08));
          }
          goto LAB_00189a72;
        }
        if ((so.lazy & 1U) == 0) {
LAB_00189117:
          local_1 = 0;
          local_88 = 1;
        }
        else {
          uVar3 = vec<int>::size((vec<int> *)(in_RDI + 0x60));
          iVar10 = (int)((ulong)in_stack_fffffffffffff9f8 >> 0x20);
          if (uVar3 != 0) {
            vec<int>::vec(&local_128);
            for (local_12c = 0; uVar3 = local_12c,
                uVar4 = vec<int>::size((vec<int> *)(in_RDI + 0x60)), uVar3 < uVar4;
                local_12c = local_12c + 1) {
              vec<int>::operator[]((vec<int> *)(in_RDI + 0x60),local_12c);
              vec<int>::push((vec<int> *)in_stack_fffffffffffffa10._pt,
                             (int *)CONCAT44(in_stack_fffffffffffffa0c,in_stack_fffffffffffffa08));
            }
            for (local_130 = 0; uVar3 = local_130,
                uVar4 = vec<int>::size((vec<int> *)(in_RDI + 0x80)), uVar3 < uVar4;
                local_130 = local_130 + 1) {
              vec<int>::operator[]((vec<int> *)(in_RDI + 0x80),local_130);
              vec<int>::push((vec<int> *)in_stack_fffffffffffffa10._pt,
                             (int *)CONCAT44(in_stack_fffffffffffffa0c,in_stack_fffffffffffffa08));
            }
            vec<int>::vec(&local_140);
            for (local_144 = 0; uVar3 = local_144, uVar4 = vec<int>::size(&local_128), uVar3 < uVar4
                ; local_144 = local_144 + 1) {
              vec<int>::operator[](&local_128,local_144);
              vec<int>::push((vec<int> *)in_stack_fffffffffffffa10._pt,
                             (int *)CONCAT44(in_stack_fffffffffffffa0c,in_stack_fffffffffffffa08));
            }
            for (local_148 = 0; uVar3 = local_148, uVar4 = vec<int>::size(&local_30), uVar3 < uVar4;
                local_148 = local_148 + 1) {
              vec<int>::operator[](&local_30,local_148);
              vec<int>::push((vec<int> *)in_stack_fffffffffffffa10._pt,
                             (int *)CONCAT44(in_stack_fffffffffffffa0c,in_stack_fffffffffffffa08));
            }
            vec<int>::vec(&local_158);
            for (local_15c = 0; uVar3 = local_15c, uVar4 = vec<int>::size(&local_30), uVar3 < uVar4;
                local_15c = local_15c + 1) {
              vec<int>::operator[](&local_30,local_15c);
              vec<int>::push((vec<int> *)in_stack_fffffffffffffa10._pt,
                             (int *)CONCAT44(in_stack_fffffffffffffa0c,in_stack_fffffffffffffa08));
            }
            local_160 = 0;
            while( true ) {
              uVar3 = local_160;
              uVar4 = vec<int>::size((vec<int> *)(in_RDI + 0x80));
              iVar10 = (int)((ulong)in_stack_fffffffffffff9f8 >> 0x20);
              if (uVar4 <= uVar3) break;
              vec<int>::operator[]((vec<int> *)(in_RDI + 0x80),local_160);
              vec<int>::push((vec<int> *)in_stack_fffffffffffffa10._pt,
                             (int *)CONCAT44(in_stack_fffffffffffffa0c,in_stack_fffffffffffffa08));
              local_160 = local_160 + 1;
            }
            uVar3 = vec<int>::size((vec<int> *)(in_RDI + 0x70));
            uVar4 = vec<int>::size(&local_140);
            local_164 = uVar3 * uVar4;
            uVar3 = vec<int>::size((vec<int> *)(in_RDI + 0x60));
            uVar4 = vec<int>::size(&local_158);
            local_168 = uVar3 * uVar4;
            uVar3 = vec<int>::size(&local_30);
            uVar4 = vec<int>::size(&local_128);
            local_16c = uVar3 * uVar4;
            local_178 = ::Reason_new(in_stack_fffffffffffffa04);
            pLVar6 = Clause::operator[]((Clause *)
                                        CONCAT44(in_stack_fffffffffffffa04,in_stack_fffffffffffffa00
                                                ),iVar10);
            pLVar6->x = local_90.x;
            pLVar6 = Clause::operator[]((Clause *)
                                        CONCAT44(in_stack_fffffffffffffa04,in_stack_fffffffffffffa00
                                                ),iVar10);
            pLVar6->x = local_a4[0].x;
            vec<int>::vec<int>((vec<int> *)
                               CONCAT17(in_stack_fffffffffffffa27,
                                        CONCAT16(in_stack_fffffffffffffa26,in_stack_fffffffffffffa20
                                                )),in_stack_fffffffffffffa18);
            vec<int>::vec<int>((vec<int> *)
                               CONCAT17(in_stack_fffffffffffffa27,
                                        CONCAT16(in_stack_fffffffffffffa26,in_stack_fffffffffffffa20
                                                )),in_stack_fffffffffffffa18);
            explainAcantreachB(in_stack_fffffffffffffa60,
                               (Clause *)
                               CONCAT44(in_stack_fffffffffffffa5c,in_stack_fffffffffffffa58),
                               (int)((ulong)in_stack_fffffffffffffa50 >> 0x20),
                               (vec<int> *)
                               CONCAT44(in_stack_fffffffffffffa4c,in_stack_fffffffffffffa48),
                               in_stack_fffffffffffffa40,in_stack_fffffffffffffa3c,
                               (int)in_stack_fffffffffffffa70);
            vec<int>::~vec((vec<int> *)CONCAT44(in_stack_fffffffffffffa04,in_stack_fffffffffffffa00)
                          );
            vec<int>::~vec((vec<int> *)CONCAT44(in_stack_fffffffffffffa04,in_stack_fffffffffffffa00)
                          );
            vec<int>::vec<int>((vec<int> *)
                               CONCAT17(in_stack_fffffffffffffa27,
                                        CONCAT16(in_stack_fffffffffffffa26,in_stack_fffffffffffffa20
                                                )),in_stack_fffffffffffffa18);
            vec<int>::vec<int>((vec<int> *)
                               CONCAT17(in_stack_fffffffffffffa27,
                                        CONCAT16(in_stack_fffffffffffffa26,in_stack_fffffffffffffa20
                                                )),in_stack_fffffffffffffa18);
            explainAcantreachB(in_stack_fffffffffffffa60,
                               (Clause *)
                               CONCAT44(in_stack_fffffffffffffa5c,in_stack_fffffffffffffa58),
                               (int)((ulong)in_stack_fffffffffffffa50 >> 0x20),
                               (vec<int> *)
                               CONCAT44(in_stack_fffffffffffffa4c,in_stack_fffffffffffffa48),
                               in_stack_fffffffffffffa40,in_stack_fffffffffffffa3c,
                               (int)in_stack_fffffffffffffa70);
            vec<int>::~vec((vec<int> *)CONCAT44(in_stack_fffffffffffffa04,in_stack_fffffffffffffa00)
                          );
            vec<int>::~vec((vec<int> *)CONCAT44(in_stack_fffffffffffffa04,in_stack_fffffffffffffa00)
                          );
            vec<int>::vec<int>((vec<int> *)
                               CONCAT17(in_stack_fffffffffffffa27,
                                        CONCAT16(in_stack_fffffffffffffa26,in_stack_fffffffffffffa20
                                                )),in_stack_fffffffffffffa18);
            vec<int>::vec<int>((vec<int> *)
                               CONCAT17(in_stack_fffffffffffffa27,
                                        CONCAT16(in_stack_fffffffffffffa26,in_stack_fffffffffffffa20
                                                )),in_stack_fffffffffffffa18);
            vec<int>::operator[](&local_30,0);
            piVar5 = vec<int>::operator[](&local_128,0);
            in_stack_fffffffffffff9f8 = (iterator *)CONCAT44(iVar10,*piVar5);
            explainAcantreachB(in_stack_fffffffffffffa60,
                               (Clause *)
                               CONCAT44(in_stack_fffffffffffffa5c,in_stack_fffffffffffffa58),
                               (int)((ulong)in_stack_fffffffffffffa50 >> 0x20),
                               (vec<int> *)
                               CONCAT44(in_stack_fffffffffffffa4c,in_stack_fffffffffffffa48),
                               in_stack_fffffffffffffa40,in_stack_fffffffffffffa3c,
                               (int)in_stack_fffffffffffffa70);
            vec<int>::~vec((vec<int> *)CONCAT44(in_stack_fffffffffffffa04,in_stack_fffffffffffffa00)
                          );
            vec<int>::~vec((vec<int> *)CONCAT44(in_stack_fffffffffffffa04,in_stack_fffffffffffffa00)
                          );
            vec<int>::operator[](&local_30,0);
            vec<int>::operator[](&local_128,0);
            Reason::Reason(local_1e0,local_178);
            IntView<4>::setVal((IntView<4> *)
                               CONCAT44(in_stack_fffffffffffffa0c,in_stack_fffffffffffffa08),
                               CONCAT44(in_stack_fffffffffffffa04,in_stack_fffffffffffffa00),
                               (Reason)in_stack_fffffffffffffa10,
                               SUB81((ulong)in_stack_fffffffffffff9f8 >> 0x38,0));
            vec<int>::~vec((vec<int> *)CONCAT44(in_stack_fffffffffffffa04,in_stack_fffffffffffffa00)
                          );
            vec<int>::~vec((vec<int> *)CONCAT44(in_stack_fffffffffffffa04,in_stack_fffffffffffffa00)
                          );
            vec<int>::~vec((vec<int> *)CONCAT44(in_stack_fffffffffffffa04,in_stack_fffffffffffffa00)
                          );
            goto LAB_00189117;
          }
          vec<int>::size(&local_30);
          vec<int>::size(local_c8);
          local_f0 = ::Reason_new(in_stack_fffffffffffffa04);
          pLVar6 = Clause::operator[]((Clause *)
                                      CONCAT44(in_stack_fffffffffffffa04,in_stack_fffffffffffffa00),
                                      iVar10);
          pLVar6->x = local_90.x;
          pLVar6 = Clause::operator[]((Clause *)
                                      CONCAT44(in_stack_fffffffffffffa04,in_stack_fffffffffffffa00),
                                      iVar10);
          pLVar6->x = local_a4[0].x;
          vec<int>::vec<int>((vec<int> *)
                             CONCAT17(in_stack_fffffffffffffa27,
                                      CONCAT16(in_stack_fffffffffffffa26,in_stack_fffffffffffffa20))
                             ,in_stack_fffffffffffffa18);
          vec<int>::vec<int>((vec<int> *)
                             CONCAT17(in_stack_fffffffffffffa27,
                                      CONCAT16(in_stack_fffffffffffffa26,in_stack_fffffffffffffa20))
                             ,in_stack_fffffffffffffa18);
          vec<int>::operator[](&local_30,0);
          piVar5 = vec<int>::operator[](local_c8,0);
          in_stack_fffffffffffff9f8 = (iterator *)CONCAT44(iVar10,*piVar5);
          explainAcantreachB(in_stack_fffffffffffffa60,
                             (Clause *)CONCAT44(in_stack_fffffffffffffa5c,in_stack_fffffffffffffa58)
                             ,(int)((ulong)in_stack_fffffffffffffa50 >> 0x20),
                             (vec<int> *)
                             CONCAT44(in_stack_fffffffffffffa4c,in_stack_fffffffffffffa48),
                             in_stack_fffffffffffffa40,in_stack_fffffffffffffa3c,
                             (int)in_stack_fffffffffffffa70);
          vec<int>::~vec((vec<int> *)CONCAT44(in_stack_fffffffffffffa04,in_stack_fffffffffffffa00));
          vec<int>::~vec((vec<int> *)CONCAT44(in_stack_fffffffffffffa04,in_stack_fffffffffffffa00));
          vec<int>::operator[](&local_30,0);
          vec<int>::operator[](local_c8,0);
          Reason::Reason(local_118,local_f0);
          IntView<4>::setVal((IntView<4> *)
                             CONCAT44(in_stack_fffffffffffffa0c,in_stack_fffffffffffffa08),
                             CONCAT44(in_stack_fffffffffffffa04,in_stack_fffffffffffffa00),
                             (Reason)in_stack_fffffffffffffa10,
                             SUB81((ulong)in_stack_fffffffffffff9f8 >> 0x38,0));
          local_1 = 0;
          local_88 = 1;
        }
      }
      else {
LAB_00189a72:
        for (local_2c4 = 0; uVar3 = local_2c4, uVar4 = vec<int>::size((vec<int> *)(in_RDI + 0x60)),
            uVar3 < uVar4; local_2c4 = local_2c4 + 1) {
          vec<int>::operator[]((vec<int> *)(in_RDI + 0x60),local_2c4);
          vec<int>::push((vec<int> *)in_stack_fffffffffffffa10._pt,
                         (int *)CONCAT44(in_stack_fffffffffffffa0c,in_stack_fffffffffffffa08));
        }
        vec<int>::clear((vec<int> *)CONCAT44(in_stack_fffffffffffffa04,in_stack_fffffffffffffa00),
                        SUB81((ulong)in_stack_fffffffffffff9f8 >> 0x38,0));
        for (local_2c8 = 0; uVar3 = local_2c8, uVar4 = vec<int>::size(&local_30), uVar3 < uVar4;
            local_2c8 = local_2c8 + 1) {
          vec<int>::operator[](&local_30,local_2c8);
          vec<int>::push((vec<int> *)in_stack_fffffffffffffa10._pt,
                         (int *)CONCAT44(in_stack_fffffffffffffa0c,in_stack_fffffffffffffa08));
        }
        local_48 = local_4c + 1;
        local_4c = *(int *)(in_RDI + 0xb0) + -1;
        local_88 = 0;
      }
      vec<int>::~vec((vec<int> *)CONCAT44(in_stack_fffffffffffffa04,in_stack_fffffffffffffa00));
      if (local_88 != 0) goto LAB_0018a6cc;
    }
    IntView<4>::iterator::operator++
              ((iterator *)CONCAT44(in_stack_fffffffffffffa04,in_stack_fffffffffffffa00));
  }
  if (*(int *)(in_RDI + 0xb0) != *(int *)(in_RDI + 0x14)) {
    vec<int>::vec(&local_2d8);
    vec<int>::vec(&local_2e8);
    for (local_2ec = 0; iVar10 = (int)((ulong)in_stack_fffffffffffffa50 >> 0x20),
        local_2ec < *(int *)(in_RDI + 0x14); local_2ec = local_2ec + 1) {
      if (*(int *)(*(long *)(in_RDI + 0xa0) + (long)local_2ec * 4) < 0) {
        vec<int>::push((vec<int> *)in_stack_fffffffffffffa10._pt,
                       (int *)CONCAT44(in_stack_fffffffffffffa0c,in_stack_fffffffffffffa08));
      }
      else {
        vec<int>::push((vec<int> *)in_stack_fffffffffffffa10._pt,
                       (int *)CONCAT44(in_stack_fffffffffffffa0c,in_stack_fffffffffffffa08));
      }
    }
    local_2f0 = *(int *)(in_RDI + 0x14) - *(int *)(in_RDI + 0xb0);
    vec<int>::vec<int>((vec<int> *)
                       CONCAT17(in_stack_fffffffffffffa27,
                                CONCAT16(in_stack_fffffffffffffa26,in_stack_fffffffffffffa20)),
                       in_stack_fffffffffffffa18);
    local_2f4 = getEvidenceLit((SubCircuit<4> *)
                               CONCAT44(in_stack_fffffffffffffa6c,in_stack_fffffffffffffa68),
                               (vec<int> *)in_stack_fffffffffffffa60);
    vec<int>::~vec((vec<int> *)CONCAT44(in_stack_fffffffffffffa04,in_stack_fffffffffffffa00));
    bVar1 = Lit::operator!=(&local_2f4,::lit_True);
    if (bVar1) {
      local_318 = (Clause *)0x0;
      if ((so.lazy & 1U) != 0) {
        local_318 = ::Reason_new(in_stack_fffffffffffffa04);
        iVar8 = (int)((ulong)in_stack_fffffffffffff9f8 >> 0x20);
        pLVar6 = Clause::operator[]((Clause *)
                                    CONCAT44(in_stack_fffffffffffffa04,in_stack_fffffffffffffa00),
                                    iVar8);
        pLVar6->x = local_2f4.x;
        vec<int>::vec<int>((vec<int> *)
                           CONCAT17(in_stack_fffffffffffffa27,
                                    CONCAT16(in_stack_fffffffffffffa26,in_stack_fffffffffffffa20)),
                           in_stack_fffffffffffffa18);
        vec<int>::vec<int>((vec<int> *)
                           CONCAT17(in_stack_fffffffffffffa27,
                                    CONCAT16(in_stack_fffffffffffffa26,in_stack_fffffffffffffa20)),
                           in_stack_fffffffffffffa18);
        in_stack_fffffffffffff9f8 = (iterator *)CONCAT44(iVar8,0xffffffff);
        explainAcantreachB(in_stack_fffffffffffffa60,
                           (Clause *)CONCAT44(in_stack_fffffffffffffa5c,in_stack_fffffffffffffa58),
                           iVar10,(vec<int> *)
                                  CONCAT44(in_stack_fffffffffffffa4c,in_stack_fffffffffffffa48),
                           in_stack_fffffffffffffa40,in_stack_fffffffffffffa3c,
                           (int)in_stack_fffffffffffffa70);
        vec<int>::~vec((vec<int> *)CONCAT44(in_stack_fffffffffffffa04,in_stack_fffffffffffffa00));
        vec<int>::~vec((vec<int> *)CONCAT44(in_stack_fffffffffffffa04,in_stack_fffffffffffffa00));
      }
      uVar3 = 0;
      while (uVar4 = uVar3, uVar2 = vec<int>::size(&local_2e8), uVar3 < uVar2) {
        piVar5 = vec<int>::operator[](&local_2e8,uVar4);
        iVar10 = *piVar5;
        bVar1 = IntView<4>::setValNotR
                          ((IntView<4> *)in_stack_fffffffffffffa10._pt,
                           CONCAT44(in_stack_fffffffffffffa0c,in_stack_fffffffffffffa08));
        if (bVar1) {
          in_stack_fffffffffffffa70 = (long)iVar10;
          Reason::Reason((Reason *)&stack0xfffffffffffffcb8,local_318);
          bVar1 = IntView<4>::setVal((IntView<4> *)
                                     CONCAT44(in_stack_fffffffffffffa0c,in_stack_fffffffffffffa08),
                                     CONCAT44(in_stack_fffffffffffffa04,in_stack_fffffffffffffa00),
                                     (Reason)in_stack_fffffffffffffa10,
                                     SUB81((ulong)in_stack_fffffffffffff9f8 >> 0x38,0));
          in_stack_fffffffffffffa6c = CONCAT13(bVar1,(int3)in_stack_fffffffffffffa6c);
          if (((bVar1 ^ 0xffU) & 1) != 0) {
            local_1 = 0;
            local_88 = 1;
            goto LAB_0018a033;
          }
        }
        uVar3 = uVar4 + 1;
      }
    }
    local_88 = 0;
LAB_0018a033:
    vec<int>::~vec((vec<int> *)CONCAT44(in_stack_fffffffffffffa04,in_stack_fffffffffffffa00));
    vec<int>::~vec((vec<int> *)CONCAT44(in_stack_fffffffffffffa04,in_stack_fffffffffffffa00));
    if (local_88 != 0) goto LAB_0018a6cc;
  }
  if (((*(byte *)(in_RDI + 0x23) & 1) != 0) && (1 < local_48)) {
    vec<int>::vec((vec<int> *)&stack0xfffffffffffffca8);
    vec<int>::vec(&local_368);
    for (local_36c = 0; iVar10 = (int)in_stack_fffffffffffffa70, local_36c < *(int *)(in_RDI + 0x14)
        ; local_36c = local_36c + 1) {
      if ((*(int *)(*(long *)(in_RDI + 0xa0) + (long)local_36c * 4) < local_48) &&
         (-1 < *(int *)(*(long *)(in_RDI + 0xa0) + (long)local_36c * 4))) {
        if (0 < *(int *)(*(long *)(in_RDI + 0xa0) + (long)local_36c * 4)) {
          vec<int>::push((vec<int> *)in_stack_fffffffffffffa10._pt,
                         (int *)CONCAT44(in_stack_fffffffffffffa0c,in_stack_fffffffffffffa08));
        }
      }
      else {
        vec<int>::push((vec<int> *)in_stack_fffffffffffffa10._pt,
                       (int *)CONCAT44(in_stack_fffffffffffffa0c,in_stack_fffffffffffffa08));
      }
    }
    vec<int>::vec<int>((vec<int> *)
                       CONCAT17(in_stack_fffffffffffffa27,
                                CONCAT16(in_stack_fffffffffffffa26,in_stack_fffffffffffffa20)),
                       in_stack_fffffffffffffa18);
    local_370 = getEvidenceLit((SubCircuit<4> *)
                               CONCAT44(in_stack_fffffffffffffa6c,in_stack_fffffffffffffa68),
                               (vec<int> *)in_stack_fffffffffffffa60);
    vec<int>::~vec((vec<int> *)CONCAT44(in_stack_fffffffffffffa04,in_stack_fffffffffffffa00));
    local_384 = ::lit_True.x;
    bVar1 = Lit::operator!=(&local_370,::lit_True);
    if (bVar1) {
      local_390 = (SubCircuit<4> *)0x0;
      if ((so.lazy & 1U) != 0) {
        uVar3 = vec<int>::size(&local_368);
        iVar8 = (int)((ulong)in_stack_fffffffffffff9f8 >> 0x20);
        vec<int>::size((vec<int> *)&stack0xfffffffffffffca8);
        this_00 = (SubCircuit<4> *)::Reason_new(in_stack_fffffffffffffa04);
        local_390 = this_00;
        pLVar6 = Clause::operator[]((Clause *)
                                    CONCAT44(in_stack_fffffffffffffa04,in_stack_fffffffffffffa00),
                                    iVar8);
        pLVar6->x = local_370.x;
        pSVar9 = local_390;
        vec<int>::vec<int>((vec<int> *)
                           CONCAT17(in_stack_fffffffffffffa27,
                                    CONCAT16(in_stack_fffffffffffffa26,in_stack_fffffffffffffa20)),
                           in_stack_fffffffffffffa18);
        reasonIndex = (int)((ulong)pSVar9 >> 0x20);
        vec<int>::vec<int>((vec<int> *)
                           CONCAT17(in_stack_fffffffffffffa27,
                                    CONCAT16(in_stack_fffffffffffffa26,in_stack_fffffffffffffa20)),
                           in_stack_fffffffffffffa18);
        in_stack_fffffffffffff9f8 = (iterator *)CONCAT44(iVar8,0xffffffff);
        explainAcantreachB(this_00,(Clause *)CONCAT44(uVar3,in_stack_fffffffffffffa58),reasonIndex,
                           (vec<int> *)CONCAT44(in_stack_fffffffffffffa4c,in_stack_fffffffffffffa48)
                           ,in_stack_fffffffffffffa40,in_stack_fffffffffffffa3c,iVar10);
        vec<int>::~vec((vec<int> *)CONCAT44(in_stack_fffffffffffffa04,in_stack_fffffffffffffa00));
        vec<int>::~vec((vec<int> *)CONCAT44(in_stack_fffffffffffffa04,in_stack_fffffffffffffa00));
      }
      for (local_3b4 = 0; local_3b4 < *(int *)(in_RDI + 0x14); local_3b4 = local_3b4 + 1) {
        if ((local_3b4 != local_20.forward.var._4_4_) &&
           (*(int *)(*(long *)(in_RDI + 0xa0) + (long)local_3b4 * 4) < local_48)) {
          addPropagation((SubCircuit<4> *)
                         CONCAT17(in_stack_fffffffffffffa27,
                                  CONCAT16(in_stack_fffffffffffffa26,in_stack_fffffffffffffa20)),
                         SUB81((ulong)in_stack_fffffffffffffa18 >> 0x38,0),
                         (int)in_stack_fffffffffffffa18,
                         (int)((ulong)in_stack_fffffffffffffa10 >> 0x20),
                         (Clause *)CONCAT44(in_stack_fffffffffffffa0c,in_stack_fffffffffffffa08));
        }
      }
    }
    vec<int>::~vec((vec<int> *)CONCAT44(in_stack_fffffffffffffa04,in_stack_fffffffffffffa00));
    vec<int>::~vec((vec<int> *)CONCAT44(in_stack_fffffffffffffa04,in_stack_fffffffffffffa00));
  }
  local_3b8 = 0;
  while (uVar3 = local_3b8,
        uVar4 = vec<SubCircuit<4>::PROP>::size((vec<SubCircuit<4>::PROP> *)(in_RDI + 0x90)),
        uVar3 < uVar4) {
    pPVar7 = vec<SubCircuit<4>::PROP>::operator[]
                       ((vec<SubCircuit<4>::PROP> *)(in_RDI + 0x90),local_3b8);
    local_3d0 = pPVar7->reason;
    local_3c8._0_4_ = pPVar7->var;
    local_3c8._4_4_ = pPVar7->val;
    local_3c0 = *(ulong *)&pPVar7->fix;
    if ((local_3c0 & 1) == 0) {
      bVar1 = IntView<4>::remValNotR
                        ((IntView<4> *)CONCAT44(in_stack_fffffffffffffa04,in_stack_fffffffffffffa00)
                         ,(int64_t)in_stack_fffffffffffff9f8);
      if (bVar1) {
        in_stack_fffffffffffffa10._pt =
             (Clause *)(*(long *)(in_RDI + 0x18) + (long)(int)local_3c8 * 0x10);
        Reason::Reason(&local_3e0,local_3d0);
        bVar1 = IntView<4>::remVal((IntView<4> *)
                                   CONCAT44(in_stack_fffffffffffffa0c,in_stack_fffffffffffffa08),
                                   CONCAT44(in_stack_fffffffffffffa04,in_stack_fffffffffffffa00),
                                   (Reason)in_stack_fffffffffffffa10,
                                   SUB81((ulong)in_stack_fffffffffffff9f8 >> 0x38,0));
        in_stack_fffffffffffffa0c = CONCAT13(bVar1,(int3)in_stack_fffffffffffffa0c);
        if (((bVar1 ^ 0xffU) & 1) != 0) {
          local_1 = 0;
          local_88 = 1;
          goto LAB_0018a6cc;
        }
      }
    }
    else {
      bVar1 = IntView<4>::setValNotR
                        ((IntView<4> *)in_stack_fffffffffffffa10._pt,
                         CONCAT44(in_stack_fffffffffffffa0c,in_stack_fffffffffffffa08));
      if (bVar1) {
        Reason::Reason(&local_3d8,local_3d0);
        bVar1 = IntView<4>::setVal((IntView<4> *)
                                   CONCAT44(in_stack_fffffffffffffa0c,in_stack_fffffffffffffa08),
                                   CONCAT44(in_stack_fffffffffffffa04,in_stack_fffffffffffffa00),
                                   (Reason)in_stack_fffffffffffffa10,
                                   SUB81((ulong)in_stack_fffffffffffff9f8 >> 0x38,0));
        if (((bVar1 ^ 0xffU) & 1) != 0) {
          local_1 = 0;
          local_88 = 1;
          goto LAB_0018a6cc;
        }
      }
    }
    local_3b8 = local_3b8 + 1;
  }
  local_1 = 1;
  local_88 = 1;
LAB_0018a6cc:
  vec<int>::~vec((vec<int> *)CONCAT44(in_stack_fffffffffffffa04,in_stack_fffffffffffffa00));
  return (bool)(local_1 & 1);
}

Assistant:

bool propagateSCC(int root) {
		int backfrom = 0;  // the last back edge found
		int backto = 0;
		int numback = 0;  // the number of back edges found

		vec<int> thisSubtree;

		thisSubtree.reserve(size);
		prev.clear();
		earlier.clear();
		later.clear();

		assert(!x[root].isFixed() || x[root].getVal() != root);
		for (int i = 0; i < size; i++) {
			index[i] = -1;  // unvisited
		}

		index[root] = 0;  // first node visited
		lowlink[root] = 0;

		nodesSeen = 1;  // only seen root node
		propQueue.clear();

		// original subtree is just the root node
		int startSubtree = 0;
		int endSubtree = 0;

		// explore children of the root node
		for (typename IntView<U>::iterator i = x[root].begin(); i != x[root].end(); ++i) {
			const int child = *i;

			if (index[child] == -1)  // if haven't explored this yet
			{
				numback = 0;
				if (!exploreSubtree(child, startSubtree, endSubtree, &backfrom, &backto, &numback)) {
					// fprintf(stderr, "failed in subtree\n");
					return false;  // fail if we found a scc within the child
				}

				// Find the nodes in the subtree we just explored and the ones still to be explored
				thisSubtree.clear();
				later.clear();
				for (int i = 0; i < size; i++) {
					if (index[i] < 0) {
						later.push(i);
					} else if (index[i] > endSubtree) {
						thisSubtree.push(i);
					}
				}

				const Lit evidenceThis = getEvidenceLit(thisSubtree);
				Lit evidenceOther = getEvidenceLit(prev);
				vec<int> alloutside;
				if (prev.size() == 0) {
					for (unsigned int i = 0; i < later.size(); i++) {
						alloutside.push(later[i]);
					}
					alloutside.push(root);
					evidenceOther = getEvidenceLit(alloutside);
				}

				if (evidenceThis != lit_True && evidenceOther != lit_True) {
					// If there's no edge from the new subtree back to the
					// previous one and both of these groups has
					// a variable definitely in, fail
					if (numback == 0) {
						// XXX [AS] Commented following line, because propagator related statistics
						// should be collected within the propagator class.
						// engine.nobackedge++;
						if (so.lazy) {
							// If prev is empty then this is the first subtree,
							// and we just need to say that
							// the nodes in this subtree can't reach the
							// unexplored nodes or the root.
							// This is only a problem if something outside this subtree has to be in.
							if (prev.size() == 0) {
								Clause* r = Reason_new(thisSubtree.size() * alloutside.size() + 2);
								(*r)[1] = evidenceThis;
								(*r)[2] = evidenceOther;
								// This subtree can't reach outside
								explainAcantreachB(r, 3, thisSubtree, alloutside, thisSubtree[0], alloutside[0]);
								x[thisSubtree[0]].setVal(alloutside[0], r);

								return false;
							}

							// Assuming we have at least one previous subtree,
							// the reason we're failing is that
							// 1. nodes in earlier subtrees can't reach the
							// previous one this one or unexplored ones,
							// 2. nodes in the previous subtree can't reach
							// this one or unexplored ones,
							// 3. and nodes in this subtree can't reach the
							// previous one or unexplored ones.
							vec<int> prev_later;
							for (unsigned int i = 0; i < prev.size(); i++) {
								prev_later.push(prev[i]);
							}
							for (unsigned int i = 0; i < later.size(); i++) {
								prev_later.push(later[i]);
							}
							vec<int> prev_this_later;
							for (unsigned int i = 0; i < prev_later.size(); i++) {
								prev_this_later.push(prev_later[i]);
							}
							for (unsigned int i = 0; i < thisSubtree.size(); i++) {
								prev_this_later.push(thisSubtree[i]);
							}
							vec<int> this_later;
							for (unsigned int i = 0; i < thisSubtree.size(); i++) {
								this_later.push(thisSubtree[i]);
							}
							for (unsigned int i = 0; i < later.size(); i++) {
								this_later.push(later[i]);
							}

							const int size1 = earlier.size() * prev_this_later.size();
							const int size2 = prev.size() * this_later.size();
							const int size3 = thisSubtree.size() * prev_later.size();
							assert(prev_later.size() > 0);
							Clause* r = Reason_new(size1 + size2 + size3 + 2);
							(*r)[1] = evidenceThis;
							(*r)[2] = evidenceOther;
							// 1. Earlier can't reach prev, this or later
							explainAcantreachB(r, 3, earlier, prev_this_later);

							// 2. Prev can't reach this or later
							explainAcantreachB(r, 3 + size1, prev, this_later);

							// 3. this can't reach prev or later
							explainAcantreachB(r, 3 + size1 + size2, thisSubtree, prev_later, thisSubtree[0],
																 prev_later[0]);
							x[thisSubtree[0]].setVal(prev_later[0], r);
						}
						return false;
					}

					// If there's only one, the back edge is required (only propagate if the option is set)
					if (fixReq && numback == 1) {
						// XXX [AS] Commented following line, because propagator related statistics
						// should be collected within the propagator class.
						// engine.fixedBackedge++;
						Clause* r = nullptr;
						if (so.lazy) {
							// If this is the first subtree, the reason we're setting this link is that
							// there is no other link between nodes of this subtree to nodes outside the subtree
							// including the root
							if (prev.size() == 0) {
								r = Reason_new(thisSubtree.size() * alloutside.size() + 2);
								(*r)[1] = evidenceThis;
								(*r)[2] = evidenceOther;
								// This subtree can't reach outside (except backfrom to backto)
								explainAcantreachB(r, 3, thisSubtree, alloutside, backfrom, backto);
							} else {
								// Otherwise we have at least one previous subtree.
								// The reason is the same as when failing above,
								// but we leave out the one we're setting
								vec<int> prev_later;
								for (unsigned int i = 0; i < prev.size(); i++) {
									prev_later.push(prev[i]);
								}
								for (unsigned int i = 0; i < later.size(); i++) {
									prev_later.push(later[i]);
								}
								vec<int> prev_this_later;
								for (unsigned int i = 0; i < prev_later.size(); i++) {
									prev_this_later.push(prev_later[i]);
								}
								for (unsigned int i = 0; i < thisSubtree.size(); i++) {
									prev_this_later.push(thisSubtree[i]);
								}
								vec<int> this_later;
								for (unsigned int i = 0; i < thisSubtree.size(); i++) {
									this_later.push(thisSubtree[i]);
								}
								for (unsigned int i = 0; i < later.size(); i++) {
									this_later.push(later[i]);
								}

								const int size1 = earlier.size() * prev_this_later.size();
								const int size2 = prev.size() * this_later.size();
								const int size3 = thisSubtree.size() * prev_later.size();
								r = Reason_new(size1 + size2 + size3 + 2);
								(*r)[1] = evidenceThis;
								(*r)[2] = evidenceOther;

								// 1. Earlier can't reach prev, this or later
								explainAcantreachB(r, 3, earlier, prev_this_later);

								// 2. Prev can't reach this or later
								explainAcantreachB(r, 3 + size1, prev, this_later);

								// 3. this can't reach prev or unexplored (except for the one we're setting)
								explainAcantreachB(r, 3 + size1 + size2, thisSubtree, prev_later, backfrom, backto);
							}
						}

						addPropagation(true, backfrom, backto, r);
					}
				}

				// When a new subtree has been explored, update the prev and earlier vectors (only necessary
				// if explaining)
				for (unsigned int i = 0; i < prev.size(); i++) {
					earlier.push(prev[i]);
				}
				prev.clear();
				for (unsigned int i = 0; i < thisSubtree.size(); i++) {
					prev.push(thisSubtree[i]);
				}

				// Set the new subtree boundaries
				startSubtree = endSubtree + 1;
				endSubtree = nodesSeen - 1;
			}
		}

		// If we haven't reached all of the nodes and something we have reached has to
		// be included, then set everything outside to take its own index
		if (nodesSeen != size) {
			vec<int> seen;
			vec<int> notseen;

			for (int var = 0; var < size; var++) {
				if (index[var] >= 0) {
					seen.push(var);
				} else {
					notseen.push(var);
				}
			}
			const int numNotSeen = size - nodesSeen;
			assert(static_cast<int>(seen.size()) == nodesSeen);
			assert(static_cast<int>(notseen.size()) == numNotSeen);

			const Lit evidenceSeen = getEvidenceLit(seen);
			if (evidenceSeen != lit_True) {
				// XXX [AS] Commented following line, because propagator related statistics
				// should be collected within the propagator class.
				// engine.disconnected++;
				Clause* r = nullptr;

				if (so.lazy) {
					// need to say that each seen node doesn't reach any non-seen node
					r = Reason_new(nodesSeen * numNotSeen + 2);
					(*r)[1] = evidenceSeen;
					explainAcantreachB(r, 2, seen, notseen);
				}
				for (unsigned int i = 0; i < notseen.size(); i++) {
					const int outsideVar = notseen[i];
					if (x[outsideVar].setValNotR(outsideVar)) {
						if (!x[outsideVar].setVal(outsideVar, r)) {
							return false;
						}
					}
				}
			}
		}

		// If we're pruning root edges and there was more than one subtree, prune edges from the root to
		// earlier subtrees
		if (pruneRoot && startSubtree > 1) {
			// Check there's evidence
			// First find the nodes in the last subtree (and disconnected nodes) and those in the earlier
			// ones

			vec<int> lastSubtreeAndOutside;
			vec<int> earlierSubtree;
			for (int i = 0; i < size; i++) {
				if (index[i] >= startSubtree || index[i] < 0) {
					lastSubtreeAndOutside.push(i);
				} else if (index[i] > 0) {  // The root is considered in no subtree
					earlierSubtree.push(i);
				} else {
					assert(i == root);
				}
			}
			assert(earlierSubtree.size() > 0);
			assert(earlierSubtree.size() + lastSubtreeAndOutside.size() + 1 ==
						 static_cast<unsigned int>(size));
			const Lit evidenceLast = getEvidenceLit(lastSubtreeAndOutside);
			if (evidenceLast != lit_True) {
				// Build the reason if necessary (it will be the same for all of the pruned edges)
				Clause* r = nullptr;
				if (so.lazy) {
					// Reason should state that no var in an earlier sub tree reaches a var
					// in the last subtree or outside
					r = Reason_new(earlierSubtree.size() * lastSubtreeAndOutside.size() + 2);
					(*r)[1] = evidenceLast;
					explainAcantreachB(r, 2, earlierSubtree, lastSubtreeAndOutside);
				}

				// Prune all edges from the root to nodes in earlier subtrees
				for (int i = 0; i < size; i++) {
					if (i != root && index[i] < startSubtree) {
						addPropagation(false, root, i, r);
					}
				}

				/* for (typename IntView<U>::iterator i = x[root].begin(); i != x[root].end(); ++i)
				 {
						 if(*i != root && index[*i] < startSubtree)
						 {
								 // XXX [AS] Commented following line, because propagator related statistics
								 // should be collected within the propagator class.
								 //engine.prunedRoot++;
								 addPropagation(false, root, *i, r);
						 }
				 }*/
			}
		}

		// Perform the propagations
		for (unsigned int i = 0; i < propQueue.size(); i++) {
			PROP const p = propQueue[i];
			// fprintf(stderr, "propagating\n");
			if (p.fix) {
				if (x[p.var].setValNotR(p.val)) {
					if (!x[p.var].setVal(p.val, p.reason)) {
						return false;
					}
				}
			} else {
				if (x[p.var].remValNotR(p.val)) {
					if (!x[p.var].remVal(p.val, p.reason)) {
						return false;
					}
				}
			}
		}
		return true;
	}